

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void xxHash64_test(void *key,int len,uint32_t seed,void *out)

{
  unsigned_long_long uVar1;
  unsigned_long_long *in_RCX;
  unsigned_long_long in_stack_00000040;
  size_t in_stack_00000048;
  void *in_stack_00000050;
  
  uVar1 = XXH64(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  *in_RCX = uVar1;
  return;
}

Assistant:

inline void xxHash64_test( const void * key, int len, uint32_t seed, void * out ) {
  // objsize 630-7fc + c10-1213: 1999
  *(uint64_t*)out = (uint64_t) XXH64(key, (size_t) len, (unsigned long long) seed);
}